

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall ON_ClassArray<ON_BrepVertex>::Empty(ON_ClassArray<ON_BrepVertex> *this)

{
  undefined8 *puVar1;
  uchar *puVar2;
  ON_BrepVertex *pOVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)this->m_count;
  if (0 < lVar4) {
    uVar5 = lVar4 + 1;
    lVar4 = lVar4 * 0x58;
    do {
      (**(code **)(*(long *)((long)&this->m_a[-1].super_ON_Point.super_ON_Geometry.super_ON_Object.
                                    _vptr_ON_Object + lVar4) + 0x18))
                ((long)&this->m_a[-1].super_ON_Point.super_ON_Geometry.super_ON_Object.
                        _vptr_ON_Object + lVar4);
      pOVar3 = this->m_a;
      puVar1 = (undefined8 *)((long)&pOVar3[-1].m_ei.m_a + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar2 = &pOVar3[-1].m_status.m_status_flags + lVar4;
      *(undefined8 *)puVar2 = 0;
      *(undefined8 *)(puVar2 + 8) = 0;
      puVar1 = (undefined8 *)((long)&pOVar3[-1].super_ON_Point.point.z + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pOVar3[-1].super_ON_Point.point.x + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)
               ((long)&pOVar3[-1].super_ON_Point.super_ON_Geometry.super_ON_Object._vptr_ON_Object +
               lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pOVar3[-1].m_tolerance + lVar4) = 0;
      ON_BrepVertex::ON_BrepVertex
                ((ON_BrepVertex *)
                 ((long)&this->m_a[-1].super_ON_Point.super_ON_Geometry.super_ON_Object.
                         _vptr_ON_Object + lVar4));
      uVar5 = uVar5 - 1;
      lVar4 = lVar4 + -0x58;
    } while (1 < uVar5);
  }
  this->m_count = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}